

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTableCopyExpr
          (BinaryReaderIR *this,Index dst_index,Index src_index)

{
  undefined4 index;
  Location local_100;
  Var local_e0;
  Location local_98;
  Var local_78;
  undefined1 local_30 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  undefined1 local_20 [8];
  Index src_index_local;
  Index dst_index_local;
  BinaryReaderIR *this_local;
  
  local_20._0_4_ = src_index;
  local_20._4_4_ = dst_index;
  _src_index_local = this;
  GetLocation(&local_98,this);
  Var::Var(&local_78,dst_index,&local_98);
  index = local_20._0_4_;
  GetLocation(&local_100,this);
  Var::Var(&local_e0,index,&local_100);
  std::make_unique<wabt::TableCopyExpr,wabt::Var,wabt::Var>((Var *)local_30,&local_78);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TableCopyExpr,std::default_delete<wabt::TableCopyExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,
             (unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> *)local_30)
  ;
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_>::~unique_ptr
            ((unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> *)local_30)
  ;
  Var::~Var(&local_e0);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTableCopyExpr(Index dst_index, Index src_index) {
  return AppendExpr(std::make_unique<TableCopyExpr>(
      Var(dst_index, GetLocation()), Var(src_index, GetLocation())));
}